

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O3

IPCDeserializer * __thiscall
gnilk::IPCResultSummary::GetDeserializerForObject(IPCResultSummary *this,uint8_t idObject)

{
  undefined8 *puVar1;
  IPCDeserializer *pIVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  iVar3 = (int)CONCAT71(in_register_00000031,idObject);
  if (iVar3 == 0x83) {
    puVar1 = (undefined8 *)operator_new(0x30);
    pIVar2 = (IPCDeserializer *)(puVar1 + 1);
    *puVar1 = &PTR__IPCAssertError_001db410;
    puVar1[1] = &PTR__IPCAssertError_001db448;
    puVar1[2] = &PTR__AssertError_001dac38;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[5] = 0;
  }
  else if (iVar3 == 0x82) {
    puVar1 = (undefined8 *)operator_new(0x60);
    puVar1[4] = 0;
    puVar1[5] = 0;
    pIVar2 = (IPCDeserializer *)(puVar1 + 1);
    *puVar1 = &PTR__IPCTestResults_001db4b0;
    puVar1[1] = &PTR__IPCTestResults_001db4e8;
    puVar1[2] = puVar1 + 4;
    puVar1[3] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1[8] = &PTR__AssertError_001dac38;
    puVar1[9] = 0;
    puVar1[10] = 0;
    puVar1[0xb] = 0;
  }
  else if (iVar3 == 0x80) {
    pIVar2 = &this->super_IPCDeserializer;
  }
  else {
    pIVar2 = (IPCDeserializer *)0x0;
  }
  return pIVar2;
}

Assistant:

IPCDeserializer *IPCResultSummary::GetDeserializerForObject(uint8_t idObject) {
    switch(idObject) {
        case kMsgType_ResultSummary :
            return this;
        case kMsgType_TestResults :
            return (new IPCTestResults());
        case kMsgType_AssertError :
            return new IPCAssertError();
    }
    return nullptr;
}